

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.h
# Opt level: O2

void __thiscall
slang::SourceManager::FileData::FileData
          (FileData *this,path *directory,string *name,SmallVector<char,_40UL> *data,path *fullPath)

{
  std::__cxx11::string::string(&this->name,name);
  SmallVector<char,_40UL>::SmallVector(&this->mem,&data->super_SmallVectorBase<char>);
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->directory = directory;
  std::filesystem::__cxx11::path::path(&this->fullPath,fullPath);
  return;
}

Assistant:

FileData(const std::filesystem::path* directory, std::string name, SmallVector<char>&& data,
                 std::filesystem::path fullPath) :
            name(std::move(name)), mem(std::move(data)), directory(directory),
            fullPath(std::move(fullPath)) {}